

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::TestMutualRecursionA::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestMutualRecursionA **v1;
  TestMutualRecursionA **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedPtrField<edition_unittest::TestMutualRecursionA_SubGroupR> *this;
  RepeatedPtrField<edition_unittest::TestMutualRecursionA_SubGroupR> *other;
  uint32_t *puVar3;
  TestMutualRecursionB *pTVar4;
  TestMutualRecursionA_SubGroup *pTVar5;
  LogMessage local_b8;
  Voidify local_a2;
  byte local_a1;
  LogMessage local_a0;
  Voidify local_89;
  uint local_88;
  uint32_t cached_has_bits;
  LogMessage local_78;
  Voidify local_61;
  TestMutualRecursionA *local_60;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestMutualRecursionA *from;
  TestMutualRecursionA *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_20;
  char *local_18;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (TestMutualRecursionA *)to_msg;
  _this = (TestMutualRecursionA *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_60 = (TestMutualRecursionA *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestMutualRecursionA_const*>(&local_60);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestMutualRecursionA*>(&from);
  local_58 = absl::lts_20250127::log_internal::
             Check_NEImpl<edition_unittest::TestMutualRecursionA_const*,edition_unittest::TestMutualRecursionA*>
                       (v1,v2,"&from != _this");
  if (local_58 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_58);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
               ,0x58cb,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_78);
  }
  local_88 = 0;
  this = _internal_mutable_subgroupr(from);
  other = _internal_subgroupr((TestMutualRecursionA *)arena);
  google::protobuf::RepeatedPtrField<edition_unittest::TestMutualRecursionA_SubGroupR>::MergeFrom
            (this,other);
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  local_88 = *puVar3;
  if ((local_88 & 3) != 0) {
    if ((local_88 & 1) != 0) {
      local_a1 = 0;
      if ((arena->impl_).first_arena_.ptr_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x58d4,"from._impl_.bb_ != nullptr");
        local_a1 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar2);
      }
      if ((local_a1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a0);
      }
      if ((from->field_0)._impl_.bb_ == (TestMutualRecursionB *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.ptr_._M_b._M_p;
        local_20 = absl_log_internal_check_op_result;
        pTVar4 = (TestMutualRecursionB *)
                 google::protobuf::Arena::CopyConstruct<edition_unittest::TestMutualRecursionB>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.bb_ = pTVar4;
      }
      else {
        TestMutualRecursionB::MergeFrom
                  ((from->field_0)._impl_.bb_,
                   (TestMutualRecursionB *)(arena->impl_).first_arena_.ptr_._M_b._M_p);
      }
    }
    if ((local_88 & 2) != 0) {
      if ((arena->impl_).first_arena_.limit_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x58dc,"from._impl_.subgroup_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_a2,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b8);
      }
      if ((from->field_0)._impl_.subgroup_ == (TestMutualRecursionA_SubGroup *)0x0) {
        local_18 = (arena->impl_).first_arena_.limit_;
        local_10 = absl_log_internal_check_op_result;
        pTVar5 = (TestMutualRecursionA_SubGroup *)
                 google::protobuf::Arena::
                 CopyConstruct<edition_unittest::TestMutualRecursionA_SubGroup>
                           ((Arena *)absl_log_internal_check_op_result,local_18);
        (from->field_0)._impl_.subgroup_ = pTVar5;
      }
      else {
        TestMutualRecursionA_SubGroup::MergeFrom
                  ((from->field_0)._impl_.subgroup_,
                   (TestMutualRecursionA_SubGroup *)(arena->impl_).first_arena_.limit_);
      }
    }
  }
  uVar1 = local_88;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestMutualRecursionA::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestMutualRecursionA*>(&to_msg);
  auto& from = static_cast<const TestMutualRecursionA&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestMutualRecursionA)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_subgroupr()->MergeFrom(
      from._internal_subgroupr());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.bb_ != nullptr);
      if (_this->_impl_.bb_ == nullptr) {
        _this->_impl_.bb_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.bb_);
      } else {
        _this->_impl_.bb_->MergeFrom(*from._impl_.bb_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.subgroup_ != nullptr);
      if (_this->_impl_.subgroup_ == nullptr) {
        _this->_impl_.subgroup_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.subgroup_);
      } else {
        _this->_impl_.subgroup_->MergeFrom(*from._impl_.subgroup_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}